

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
cs::instance_type::parse_define_structured_binding
          (instance_type *this,iterator it,bool constant,bool link)

{
  byte in_CL;
  byte in_DL;
  anon_class_24_4_27019cfb *in_RDI;
  var *val;
  function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> process;
  undefined1 in_stack_0000088f;
  iterator *in_stack_00000890;
  runtime_type *in_stack_00000898;
  any *in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff50;
  function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)>
  *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> *this_00;
  iterator in_stack_ffffffffffffff90;
  iterator *in_stack_ffffffffffffff98;
  function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> local_38;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  this_00 = &local_38;
  std::function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)>::function
            ((function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> *)
             in_stack_ffffffffffffff50.mData);
  std::function<void(cs::tree_type<cs::token_base*>::iterator,cs_impl::any_const&)>::operator=
            (this_00,in_RDI);
  if ((local_11 & 1) == 0) {
    in_stack_ffffffffffffff50 =
         tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffff98);
    runtime_type::parse_expr(in_stack_00000898,in_stack_00000890,(bool)in_stack_0000088f);
  }
  else {
    in_stack_ffffffffffffff60 =
         tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff58 =
         (function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> *)
         tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_ffffffffffffff90.mData);
    token_value::get_value
              (*(token_value **)&(in_stack_ffffffffffffff58->super__Function_base)._M_functor);
    cs_impl::any::any((any *)in_stack_ffffffffffffff50.mData,in_stack_ffffffffffffff48);
  }
  tree_type<cs::token_base_*>::iterator::left((iterator *)&stack0xffffffffffffff90);
  std::function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)>::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
             (any *)in_stack_ffffffffffffff50.mData);
  cs_impl::any::~any((any *)0x1b358f);
  std::function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)>::~function
            ((function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> *)
             0x1b359c);
  return;
}

Assistant:

void
	instance_type::parse_define_structured_binding(tree_type<token_base *>::iterator it, bool constant, bool link)
	{
		std::function<void(tree_type<token_base *>::iterator, const var &)> process;
		process = [&process, this, constant, link](tree_type<token_base *>::iterator it, const var &val) {
			auto &pl = static_cast<token_parallel *>(it.data())->get_parallel();
			if (val.type() != typeid(array))
				throw runtime_error("Only support structured binding with array while variable definition.");
			auto &arr = val.const_val<array>();
			if (pl.size() != arr.size())
				throw runtime_error("Unmatched structured binding while variable definition.");
			for (std::size_t i = 0; i < pl.size(); ++i) {
				if (pl[i].root().data()->get_type() == token_types::parallel)
					process(pl[i].root(), arr[i]);
				else
					storage.add_var_no_return(static_cast<token_id *>(pl[i].root().data())->get_id(),
					                          constant || link ? arr[i] : copy(arr[i]), constant);
			}
		};
		const var &val = constant ? static_cast<token_value *>(it.right().data())->get_value() : parse_expr(it.right());
		process(it.left(), val);
	}